

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

void __thiscall
bloaty::anon_unknown_0::ReadELFSymbols
          (anon_unknown_0 *this,InputFile *file,RangeSink *sink,SymbolTable *table,bool disassemble)

{
  undefined1 uVar1;
  undefined1 auVar2 [16];
  string_view range;
  string_view range_00;
  string_view range_01;
  string_view range_02;
  string_view label;
  string_view data;
  string_view label_00;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  char *sink_00;
  char *analyzer;
  undefined7 in_register_00000081;
  Arg *a0;
  char *index_base;
  string_view sVar6;
  string_view format;
  string_view data_00;
  string_view label_01;
  size_t in_stack_fffffffffffffd88;
  size_t sVar7;
  char *in_stack_fffffffffffffd90;
  anon_class_40_6_17eaf085 local_260;
  MemberReader reader;
  MemberFile member;
  ArFile ar_file;
  DisassemblyInfo info;
  ElfFile elf;
  
  a0 = (Arg *)CONCAT71(in_register_00000081,disassemble);
  uVar1 = SUB81(table,0);
  data_00._M_str = (char *)sink;
  data_00._M_len = *(size_t *)(this + 0x30);
  bVar4 = IsObjectFile(*(anon_unknown_0 **)(this + 0x28),data_00);
  DisassemblyInfo::DisassemblyInfo(&info);
  local_260.capstone_available = ReadElfArchMode((InputFile *)this,&info.arch,&info.mode);
  local_260.is_object = bVar4;
  local_260.sink = (RangeSink *)file;
  local_260.disassemble = (bool)uVar1;
  local_260.table = (SymbolTable *)sink;
  local_260.infop = &info;
  ArFile::ArFile(&ar_file,*(string_view *)(this + 0x28));
  bVar4 = ArFile::IsOpen(&ar_file);
  if (bVar4) {
    member.filename._M_len = 0;
    member.filename._M_str = (char *)0x0;
    member.header._M_len = 0;
    member.header._M_str = (char *)0x0;
    member.contents._M_len = 0;
    member.contents._M_str = (char *)0x0;
    reader.long_filenames_._M_len = 0;
    reader.long_filenames_._M_str = (char *)0x0;
    reader.remaining_._M_len = ar_file.contents_._M_len;
    reader.remaining_._M_str = ar_file.contents_._M_str;
    range._M_str = in_stack_fffffffffffffd90;
    range._M_len = in_stack_fffffffffffffd88;
    MaybeAddFileRange((anon_unknown_0 *)file,(char *)0xc,(RangeSink *)"[AR Headers]",ar_file.magic_,
                      range);
    sVar7 = 0;
LAB_0017e0fd:
    bVar4 = ArFile::MemberReader::ReadMember(&reader,&member);
    if (bVar4) {
      label._M_str = member.header._M_str;
      label._M_len = member.header._M_len;
      range_00._M_str = in_stack_fffffffffffffd90;
      range_00._M_len = sVar7;
      pcVar5 = (char *)member.header._M_len;
      index_base = member.header._M_str;
      MaybeAddFileRange((anon_unknown_0 *)file,(char *)0xc,(RangeSink *)"[AR Headers]",label,
                        range_00);
      sVar3 = member.contents._M_len;
      if (member.file_type == kSymbolTable) {
        sink_00 = "[AR Symbol Table]";
        analyzer = (char *)0x11;
      }
      else {
        sink_00 = "[AR Headers]";
        analyzer = (char *)0xc;
        if (member.file_type != kLongFilenameTable) {
          if (member.file_type == kNormal) {
            data._M_str = member.contents._M_str;
            data._M_len = member.contents._M_len;
            in_stack_fffffffffffffd90 = member.contents._M_str;
            ElfFile::ElfFile(&elf,data);
            if (elf.ok_ == true) {
              sVar6._M_str = pcVar5;
              sVar6._M_len = sVar7;
              ReadELFSymbols::anon_class_40_6_17eaf085::operator()
                        (&local_260,&elf,sVar6,(uint64_t)index_base);
              sVar7 = sVar7 + elf.section_count_;
            }
            else {
              range_02._M_str = in_stack_fffffffffffffd90;
              range_02._M_len = sVar7;
              label_01._M_str = in_stack_fffffffffffffd90;
              label_01._M_len = sVar3;
              MaybeAddFileRange((anon_unknown_0 *)file,(char *)0x18,
                                (RangeSink *)"[AR Non-ELF Member File]",label_01,range_02);
            }
          }
          goto LAB_0017e0fd;
        }
      }
      label_00._M_str = member.contents._M_str;
      label_00._M_len = member.contents._M_len;
      range_01._M_str = in_stack_fffffffffffffd90;
      range_01._M_len = sVar7;
      MaybeAddFileRange((anon_unknown_0 *)file,analyzer,(RangeSink *)sink_00,label_00,range_01);
      goto LAB_0017e0fd;
    }
  }
  else {
    ElfFile::ElfFile(&elf,*(string_view *)(this + 0x28));
    if (elf.ok_ == false) {
      member.filename._M_len = *(size_t *)(this + 8);
      member._0_8_ = *(undefined8 *)(this + 0x10);
      format._M_str = (char *)&member;
      format._M_len = (size_t)"Not an ELF or Archive file: $0";
      absl::Substitute_abi_cxx11_((string *)&reader,(absl *)0x1e,format,a0);
      Throw((char *)reader.long_filenames_._M_len,0x2e2);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = table;
    ReadELFSymbols::anon_class_40_6_17eaf085::operator()
              (&local_260,&elf,(string_view)(auVar2 << 0x40),(uint64_t)a0);
  }
  DualMap::~DualMap(&info.symbol_map);
  return;
}

Assistant:

static void ReadELFSymbols(const InputFile& file, RangeSink* sink,
                           SymbolTable* table, bool disassemble) {
  bool is_object = IsObjectFile(file.data());
  DisassemblyInfo info;
  DisassemblyInfo* infop = &info;
  bool capstone_available = ReadElfArchMode(file, &info.arch, &info.mode);

  ForEachElf(
      file, sink,
      [=](const ElfFile& elf, string_view /*filename*/, uint64_t index_base) {
        for (Elf64_Xword i = 1; i < elf.section_count(); i++) {
          ElfFile::Section section;
          elf.ReadSection(i, &section);

          if (section.header().sh_type != SHT_SYMTAB) {
            continue;
          }

          Elf64_Word symbol_count = section.GetEntryCount();

          // Find the corresponding section where the strings for the symbol
          // table can be found.
          ElfFile::Section strtab_section;
          elf.ReadSection(section.header().sh_link, &strtab_section);
          if (strtab_section.header().sh_type != SHT_STRTAB) {
            THROW("symtab section pointed to non-strtab section");
          }

          for (Elf64_Word i = 1; i < symbol_count; i++) {
            Elf64_Sym sym;

            section.ReadSymbol(i, &sym, nullptr);

            if (ELF64_ST_TYPE(sym.st_info) == STT_SECTION) {
              continue;
            }

            if (sym.st_shndx == STN_UNDEF) {
              continue;
            }

            if (sym.st_size == 0) {
              // Maybe try to refine?  See ReadELFSectionsRefineSymbols below.
              continue;
            }

            string_view name = strtab_section.ReadString(sym.st_name);
            uint64_t full_addr =
                ToVMAddr(sym.st_value, index_base + sym.st_shndx, is_object);
            if (sink && !(capstone_available && disassemble)) {
              sink->AddVMRangeAllowAlias(
                  "elf_symbols", full_addr, sym.st_size,
                  ItaniumDemangle(name, sink->data_source()));
            }
            if (table) {
              table->insert(
                  std::make_pair(name, std::make_pair(full_addr, sym.st_size)));
            }
            if (capstone_available && disassemble &&
                ELF64_ST_TYPE(sym.st_info) == STT_FUNC) {
              if (verbose_level > 1) {
                printf("Disassembling function: %s\n", name.data());
              }
              // TODO(brandonvu) Continue if VM pointer cannot be translated. Issue #315
              uint64_t unused;
              if (!sink->Translator()->vm_map.Translate(full_addr, &unused)) {
                WARN("Can't translate VM pointer ($0) to file", full_addr);
                continue;
              }
              infop->text = sink->TranslateVMToFile(full_addr).substr(0, sym.st_size);
              infop->start_address = full_addr;
              DisassembleFindReferences(*infop, sink);
            }
          }
        }
      });
}